

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O1

uint __thiscall ON_MeshNgon::BoundaryEdgeCount(ON_MeshNgon *this,ON_MeshFaceList *mesh_face_list)

{
  bool bVar1;
  uint *puVar2;
  ON_2udex *pOVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint *puVar12;
  uint uVar13;
  size_t nel;
  uint face_vi [4];
  ON_SimpleArray<ON_2udex> edge_buffer;
  uint local_58 [6];
  ON_SimpleArray<ON_2udex> local_40;
  
  uVar7 = 0;
  if (((this->m_Fcount != 0) && (uVar7 = 0, this->m_fi != (uint *)0x0)) &&
     (uVar13 = mesh_face_list->m_face_count, uVar13 != 0)) {
    uVar7 = uVar13 * 4;
    local_40._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00823e40;
    local_40.m_a = (ON_2udex *)0x0;
    local_40.m_count = 0;
    local_40.m_capacity = 0;
    if ((uVar13 & 0x3fffffff) != 0) {
      ON_SimpleArray<ON_2udex>::SetCapacity(&local_40,(ulong)uVar7);
    }
    pOVar3 = local_40.m_a;
    if ((-1 < (int)(uVar13 << 2)) && ((int)uVar7 <= local_40.m_capacity)) {
      local_40.m_count = uVar7;
    }
    if (this->m_Fcount == 0) {
      nel = 0;
    }
    else {
      puVar12 = this->m_fi;
      puVar2 = mesh_face_list->m_faces;
      bVar1 = mesh_face_list->m_bQuadFaces;
      uVar9 = 0;
      nel = 0;
      do {
        if (puVar12[uVar9] < mesh_face_list->m_face_count) {
          uVar10 = (ulong)(puVar12[uVar9] * mesh_face_list->m_face_stride);
          local_58[1] = puVar2[uVar10 + 1];
          local_58[0] = puVar2[uVar10];
          local_58[3] = puVar2[uVar10 + 2];
          if ((bVar1 & 1U) != 0) {
            local_58[3] = puVar2[uVar10 + 3];
          }
          local_58[2] = puVar2[uVar10 + 2];
        }
        else {
          local_58[0] = 0;
          local_58[1] = 0;
          local_58[2] = 0;
          local_58[3] = 0;
        }
        lVar11 = 0;
        uVar7 = local_58[3];
        do {
          uVar13 = local_58[lVar11];
          if (uVar7 != uVar13) {
            uVar8 = uVar13;
            if (uVar7 < uVar13) {
              uVar8 = uVar7;
            }
            if (uVar7 <= uVar13) {
              uVar7 = uVar13;
            }
            local_40.m_a[nel].i = uVar8;
            local_40.m_a[nel].j = uVar7;
            nel = (size_t)((int)nel + 1);
          }
          lVar11 = lVar11 + 1;
          uVar7 = uVar13;
        } while (lVar11 != 4);
        uVar9 = uVar9 + 1;
      } while (uVar9 < this->m_Fcount);
    }
    uVar13 = (uint)nel;
    ON_qsort(local_40.m_a,nel,8,Internal_compare_ngon_edges);
    if (uVar13 == 0) {
      uVar7 = 0;
    }
    else {
      uVar8 = 0;
      uVar7 = 0;
      do {
        uVar5 = uVar8 + 1;
        uVar4 = uVar5;
        if (uVar5 < uVar13) {
          puVar12 = &pOVar3[uVar5].j;
          uVar6 = uVar5;
          do {
            uVar4 = uVar6;
            if ((((ON_2udex *)(puVar12 + -1))->i != pOVar3[uVar8].i) ||
               (*puVar12 != pOVar3[uVar8].j)) break;
            uVar6 = uVar6 + 1;
            puVar12 = puVar12 + 2;
            uVar4 = uVar13;
          } while (uVar13 != uVar6);
        }
        uVar8 = uVar4;
        uVar7 = uVar7 + (uVar5 == uVar8);
      } while (uVar8 < uVar13);
    }
    ON_SimpleArray<ON_2udex>::~ON_SimpleArray(&local_40);
  }
  return uVar7;
}

Assistant:

unsigned int ON_MeshNgon::BoundaryEdgeCount(const ON_MeshFaceList & mesh_face_list) const
{
  if (m_Fcount <= 0 || nullptr == m_fi)
    return 0;
  const unsigned int mesh_face_count = mesh_face_list.FaceCount();
  if (mesh_face_count <= 0)
    return 0;

  const unsigned int edge_capacity = 4 * mesh_face_count;
  ON_SimpleArray<ON_2udex> edge_buffer(edge_capacity);
  edge_buffer.SetCount(edge_capacity);
  ON_2udex* edges = edge_buffer.Array();
  unsigned int edge_count = 0;
  unsigned int face_vi[4];

  ON_2udex e;
  for (unsigned int i = 0; i < m_Fcount; i++)
  {
    mesh_face_list.QuadFvi(m_fi[i], face_vi);
    e.j = face_vi[3];
    for (unsigned int j = 0; j < 4; j++)
    {
      e.i = e.j;
      e.j = face_vi[j];
      if (e.i == e.j)
        continue;
      if (e.i < e.j)
      {
        edges[edge_count] = e;
      }
      else
      {
        edges[edge_count].i = e.j;
        edges[edge_count].j = e.i;
      }
      edge_count++;
    }
  }

  ON_qsort(edges, edge_count, sizeof(edges[0]), Internal_compare_ngon_edges);
  unsigned int boundary_edge_count = 0;

  for (unsigned int i = 0; i < edge_count; /*empty iterator*/)
  {
    e = edges[i++];
    const unsigned int i1 = i;
    for (/*empty init*/; i < edge_count; i++)
    {
      if (edges[i].i != e.i || edges[i].j != e.j)
        break;
    }
    if (i1 == i)
      boundary_edge_count++;
  }

  return boundary_edge_count;
}